

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateOneofClear
          (MessageGenerator *this,Printer *printer)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  mapped_type *pmVar5;
  OneofDescriptor *pOVar6;
  string *psVar7;
  FieldGenerator *pFVar8;
  int i_00;
  string local_188;
  string local_168;
  string local_148;
  string local_128;
  FieldDescriptor *local_108;
  FieldDescriptor *field;
  string local_f8 [4];
  int j;
  string message_class;
  key_type local_d0;
  allocator<char> local_a9;
  key_type local_a8;
  allocator<char> local_71;
  key_type local_70;
  undefined1 local_50 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  oneof_vars;
  int i;
  Printer *printer_local;
  MessageGenerator *this_local;
  
  oneof_vars._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 0;
  while( true ) {
    uVar1 = oneof_vars._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_;
    iVar3 = Descriptor::oneof_decl_count(this->descriptor_);
    if (iVar3 <= (int)uVar1) break;
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)local_50);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"classname",&local_71);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_50,&local_70);
    std::__cxx11::string::operator=((string *)pmVar5,(string *)&this->classname_);
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator(&local_71);
    pOVar6 = Descriptor::oneof_decl
                       (this->descriptor_,
                        oneof_vars._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_);
    psVar7 = OneofDescriptor::name_abi_cxx11_(pOVar6);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"oneofname",&local_a9);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_50,&local_a8);
    std::__cxx11::string::operator=((string *)pmVar5,(string *)psVar7);
    std::__cxx11::string::~string((string *)&local_a8);
    std::allocator<char>::~allocator(&local_a9);
    psVar7 = Descriptor::full_name_abi_cxx11_(this->descriptor_);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d0,"full_name",
               (allocator<char> *)(message_class.field_2._M_local_buf + 0xf));
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_50,&local_d0);
    std::__cxx11::string::operator=((string *)pmVar5,(string *)psVar7);
    std::__cxx11::string::~string((string *)&local_d0);
    std::allocator<char>::~allocator((allocator<char> *)(message_class.field_2._M_local_buf + 0xf));
    std::__cxx11::string::string(local_f8);
    io::Printer::Print(printer,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)local_50,
                       "void $classname$::clear_$oneofname$() {\n// @@protoc_insertion_point(one_of_clear_start:$full_name$)\n"
                      );
    io::Printer::Indent(printer);
    io::Printer::Print(printer,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)local_50,"switch ($oneofname$_case()) {\n");
    io::Printer::Indent(printer);
    field._4_4_ = 0;
    while( true ) {
      iVar3 = field._4_4_;
      pOVar6 = Descriptor::oneof_decl
                         (this->descriptor_,
                          oneof_vars._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_);
      iVar4 = OneofDescriptor::field_count(pOVar6);
      if (iVar4 <= iVar3) break;
      pOVar6 = Descriptor::oneof_decl
                         (this->descriptor_,
                          oneof_vars._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_);
      local_108 = OneofDescriptor::field(pOVar6,field._4_4_);
      psVar7 = FieldDescriptor::name_abi_cxx11_(local_108);
      UnderscoresToCamelCase(&local_128,psVar7,true);
      io::Printer::Print(printer,"case k$field_name$: {\n","field_name",&local_128);
      std::__cxx11::string::~string((string *)&local_128);
      io::Printer::Indent(printer);
      bVar2 = IsStringOrMessage(local_108);
      if (bVar2) {
        pFVar8 = FieldGeneratorMap::get(&this->field_generators_,local_108);
        (*pFVar8->_vptr_FieldGenerator[9])(pFVar8,printer);
      }
      else {
        io::Printer::Print(printer,"// No need to clear\n");
      }
      io::Printer::Print(printer,"break;\n");
      io::Printer::Outdent(printer);
      io::Printer::Print(printer,"}\n");
      field._4_4_ = field._4_4_ + 1;
    }
    pOVar6 = Descriptor::oneof_decl
                       (this->descriptor_,
                        oneof_vars._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_);
    psVar7 = OneofDescriptor::name_abi_cxx11_(pOVar6);
    ToUpper(&local_148,psVar7);
    io::Printer::Print(printer,"case $cap_oneof_name$_NOT_SET: {\n  break;\n}\n","cap_oneof_name",
                       &local_148);
    std::__cxx11::string::~string((string *)&local_148);
    io::Printer::Outdent(printer);
    SimpleItoa_abi_cxx11_
              (&local_168,
               (protobuf *)(ulong)oneof_vars._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_,
               i_00);
    pOVar6 = Descriptor::oneof_decl
                       (this->descriptor_,
                        oneof_vars._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_);
    psVar7 = OneofDescriptor::name_abi_cxx11_(pOVar6);
    ToUpper(&local_188,psVar7);
    io::Printer::Print(printer,"}\n_oneof_case_[$oneof_index$] = $cap_oneof_name$_NOT_SET;\n",
                       "oneof_index",&local_168,"cap_oneof_name",&local_188);
    std::__cxx11::string::~string((string *)&local_188);
    std::__cxx11::string::~string((string *)&local_168);
    io::Printer::Outdent(printer);
    io::Printer::Print(printer,"}\n\n");
    std::__cxx11::string::~string(local_f8);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)local_50);
    oneof_vars._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
         oneof_vars._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ + 1;
  }
  return;
}

Assistant:

void MessageGenerator::
GenerateOneofClear(io::Printer* printer) {
  // Generated function clears the active field and union case (e.g. foo_case_).
  for (int i = 0; i < descriptor_->oneof_decl_count(); i++) {
    std::map<string, string> oneof_vars;
    oneof_vars["classname"] = classname_;
    oneof_vars["oneofname"] = descriptor_->oneof_decl(i)->name();
    oneof_vars["full_name"] = descriptor_->full_name();
    string message_class;

    printer->Print(oneof_vars,
                   "void $classname$::clear_$oneofname$() {\n"
                   "// @@protoc_insertion_point(one_of_clear_start:"
                   "$full_name$)\n");
    printer->Indent();
    printer->Print(oneof_vars,
        "switch ($oneofname$_case()) {\n");
    printer->Indent();
    for (int j = 0; j < descriptor_->oneof_decl(i)->field_count(); j++) {
      const FieldDescriptor* field = descriptor_->oneof_decl(i)->field(j);
      printer->Print(
          "case k$field_name$: {\n",
          "field_name", UnderscoresToCamelCase(field->name(), true));
      printer->Indent();
      // We clear only allocated objects in oneofs
      if (!IsStringOrMessage(field)) {
        printer->Print(
            "// No need to clear\n");
      } else {
        field_generators_.get(field).GenerateClearingCode(printer);
      }
      printer->Print(
          "break;\n");
      printer->Outdent();
      printer->Print(
          "}\n");
    }
    printer->Print(
        "case $cap_oneof_name$_NOT_SET: {\n"
        "  break;\n"
        "}\n",
        "cap_oneof_name",
        ToUpper(descriptor_->oneof_decl(i)->name()));
    printer->Outdent();
    printer->Print(
        "}\n"
        "_oneof_case_[$oneof_index$] = $cap_oneof_name$_NOT_SET;\n",
        "oneof_index", SimpleItoa(i),
        "cap_oneof_name",
        ToUpper(descriptor_->oneof_decl(i)->name()));
    printer->Outdent();
    printer->Print(
        "}\n"
        "\n");
  }
}